

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
* __thiscall
ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>::
operator<<(ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>
           *this,prevector<16U,_unsigned_char,_unsigned_int,_int> *obj)

{
  uint uVar1;
  long lVar2;
  CSHA256 *this_00;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = obj->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  WriteCompactSize<ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>>
            ((ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
              *)this,(ulong)uVar3);
  uVar1 = obj->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  if (uVar3 != 0) {
    if (0x10 < uVar1) {
      obj = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
            (obj->_union).indirect_contents.indirect;
    }
    this_00 = *(CSHA256 **)(*(long *)(this + 8) + 8);
    AutoFile::write(*(AutoFile **)this_00[1].s,(int)obj,(void *)(ulong)uVar3,(ulong)uVar1);
    CSHA256::Write(this_00,(uchar *)obj,(size_t)(ulong)uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
            *)this;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream& operator<<(const U& obj) { ::Serialize(*this, obj); return *this; }